

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play_song.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  char *pcVar4;
  uchar local_1ee;
  uint8_t song_len;
  int baud;
  RobotModel model;
  string port;
  uint8_t notes [9];
  float durations [9];
  Create robot;
  
  _model = create::RobotModel::CREATE_2;
  std::__cxx11::string::string((string *)&port,"/dev/ttyUSB0",(allocator *)&robot);
  baud = 0x1c200;
  pcVar4 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)&robot,argv[1],(allocator *)durations);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &robot,"create1");
    std::__cxx11::string::~string((string *)&robot);
    if (bVar1) {
      _model = create::RobotModel::CREATE_1;
      baud = 0xe100;
      pcVar4 = "Running driver for Create 1";
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  create::Create::Create(&robot,1);
  cVar2 = create::Create::connect((string *)&robot,(int *)&port);
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    poVar3 = std::operator<<(poVar3,port._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Connected to robot");
    std::endl<char,std::char_traits<char>>(poVar3);
    durations[0] = 4.2039e-45;
    create::Create::setMode((CreateMode *)&robot);
    song_len = '\t';
    builtin_memcpy(notes,"7773:73:7",9);
    durations[4] = 0.125;
    durations[5] = 0.5;
    durations[6] = 0.375;
    durations[7] = 0.125;
    durations[0] = 0.5;
    durations[1] = 0.5;
    durations[2] = 0.5;
    durations[3] = 0.375;
    durations[8] = 1.0;
    local_1ee = '\0';
    create::Create::defineSong((uchar *)&robot,&local_1ee,&song_len,(float *)notes);
    usleep(1000000);
    poVar3 = std::operator<<((ostream *)&std::cout,"Playing a song!");
    std::endl<char,std::char_traits<char>>(poVar3);
    local_1ee = '\0';
    create::Create::playSong((uchar *)&robot);
    usleep(4500000);
    create::Create::disconnect();
  }
  create::Create::~Create(&robot);
  std::__cxx11::string::~string((string *)&port);
  return (uint)(cVar2 == '\0');
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  // Useful note defintions
  const uint8_t G = 55;
  const uint8_t AS = 58;
  const uint8_t DS = 51;
  const float half = 1.0f;
  const float quarter = 0.5f;
  const float dotted_eigth = 0.375f;
  const float sixteenth = 0.125f;

  // Define a song
  const uint8_t song_len = 9;
  const uint8_t notes[song_len] = { G, G, G, DS, AS, G, DS, AS, G };
  const float durations[song_len] = { quarter, quarter, quarter, dotted_eigth, sixteenth, quarter, dotted_eigth, sixteenth, half };
  robot.defineSong(0, song_len, notes, durations);

  // Sleep to provide time for song to register
  usleep(1000000);

  std::cout << "Playing a song!" << std::endl;

  // Request to play the song we just defined
  robot.playSong(0);

  // Expect the song to take about four seconds
  usleep(4500000);

  // Call disconnect to avoid leaving robot in Full mode
  robot.disconnect();

  return 0;
}